

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::draw_pretty(Mesh *this)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  float fVar2;
  double dVar3;
  undefined1 auVar4 [16];
  _List_node_base *p_Var5;
  Mesh *this_00;
  _List_node_base *p_Var6;
  double *pdVar7;
  pointer pVVar8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> offsets;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_a8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_88;
  Mesh *local_70;
  undefined1 local_68 [16];
  double local_58;
  Vector3D local_48;
  
  check_finite_positions(this);
  local_88.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar1 = &(this->mesh).vertices;
  p_Var6 = (this->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  local_70 = this;
  if (p_Var6 != (_List_node_base *)plVar1) {
    do {
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                (&local_a8,(value_type *)&p_Var6[1]._M_prev);
      fVar2 = *(float *)((long)&p_Var6[6]._M_prev + 4);
      Vertex::normal(&local_48,(Vertex *)(p_Var6 + 1));
      dVar3 = (double)fVar2;
      local_58 = local_48.z * dVar3;
      local_68._8_4_ = SUB84(dVar3 * local_48.y,0);
      local_68._0_8_ = dVar3 * local_48.x;
      local_68._12_4_ = (int)((ulong)(dVar3 * local_48.y) >> 0x20);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                (&local_88,(value_type *)local_68);
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)plVar1);
  }
  p_Var6 = (plVar1->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)plVar1) {
    pdVar7 = &(local_88.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start)->z;
    do {
      dVar3 = (double)p_Var6[2]._M_next + pdVar7[-1];
      auVar4._8_4_ = SUB84(dVar3,0);
      auVar4._0_8_ = (double)p_Var6[1]._M_prev + ((Vector3D *)(pdVar7 + -2))->x;
      auVar4._12_4_ = (int)((ulong)dVar3 >> 0x20);
      *(undefined1 (*) [16])&p_Var6[1]._M_prev = auVar4;
      p_Var6[2]._M_prev = (_List_node_base *)(*pdVar7 + (double)p_Var6[2]._M_prev);
      p_Var6 = p_Var6->_M_next;
      pdVar7 = pdVar7 + 3;
    } while (p_Var6 != (_List_node_base *)plVar1);
  }
  glPushMatrix();
  this_00 = local_70;
  glTranslatef((float)(local_70->super_SceneObject).position.x,
               (float)(local_70->super_SceneObject).position.y,
               (float)(local_70->super_SceneObject).position.z);
  glRotatef((float)(this_00->super_SceneObject).rotation.x,0x3f800000,0,0);
  glRotatef((float)(this_00->super_SceneObject).rotation.y,0,0x3f800000,0);
  glRotatef((float)(this_00->super_SceneObject).rotation.z,0,0,0x3f800000);
  glScalef((float)(this_00->super_SceneObject).scale.x,(float)(this_00->super_SceneObject).scale.y,
           (float)(this_00->super_SceneObject).scale.z);
  if (this_00->bsdf == (BSDF *)0x0) {
    glBindTexture(0xde1,0);
    local_68._8_4_ = 0x3f800000;
    local_68._0_8_ = 0x3f8000003f800000;
    glMaterialfv(0x404,0x1201);
  }
  else {
    glBindTexture(0xde1,0);
    glMaterialfv(0x404,0x1201,&this_00->bsdf->rasterize_color);
  }
  glEnable(0xb50);
  glDisable(0xbe2);
  draw_faces(this_00,true);
  glPopMatrix();
  pVVar8 = local_a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (p_Var6 = (plVar1->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
                _M_node.super__List_node_base._M_next; p_Var6 != (_List_node_base *)plVar1;
      p_Var6 = p_Var6->_M_next) {
    p_Var6[2]._M_prev = (_List_node_base *)pVVar8->z;
    p_Var5 = (_List_node_base *)pVVar8->y;
    p_Var6[1]._M_prev = (_List_node_base *)pVVar8->x;
    p_Var6[2]._M_next = p_Var5;
    pVVar8 = pVVar8 + 1;
  }
  if (local_a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Mesh::draw_pretty() {

  check_finite_positions();

  vector<Vector3D> offsets;
  vector<Vector3D> originalPositions;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    originalPositions.push_back(v->position);
    Vector3D offset = v->offset * v->normal();
    offsets.push_back(offset);
  }

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position += offsets[i++];
  }

  glPushMatrix();
  glTranslatef(position.x, position.y, position.z);
  glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
  glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
  glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
  glScalef(scale.x, scale.y, scale.z);

  if (bsdf) {
    glBindTexture(GL_TEXTURE_2D, 0);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &bsdf->rasterize_color.r);
  } else {
    glBindTexture(GL_TEXTURE_2D, 0);
    Spectrum white = Spectrum(1., 1., 1.);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &white.r);
  }

  // Enable lighting for faces
  glEnable(GL_LIGHTING);
  glDisable(GL_BLEND);
  draw_faces(true);

  glPopMatrix();

  i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position = originalPositions[i++];
  }
}